

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11VulkanPlatform.cpp
# Opt level: O3

Window * __thiscall
tcu::x11::VulkanDisplayXlib::createWindow
          (VulkanDisplayXlib *this,Maybe<tcu::Vector<unsigned_int,_2>_> *initialSize)

{
  int *piVar1;
  XlibDisplay *this_00;
  Window *pWVar2;
  XlibWindow *this_01;
  Visual *visual;
  int width;
  int height;
  
  piVar1 = *(int **)initialSize;
  if (piVar1 == (int *)0x0) {
    width = 400;
    height = 300;
  }
  else {
    width = *piVar1;
    height = piVar1[1];
  }
  this_00 = (XlibDisplay *)
            (this->m_display).
            super_UniqueBase<tcu::x11::DisplayBase,_de::DefaultDeleter<tcu::x11::DisplayBase>_>.
            m_data.ptr;
  pWVar2 = (Window *)operator_new(0x20);
  this_01 = (XlibWindow *)operator_new(0x28);
  visual = XlibDisplay::getVisual(this_00,0);
  XlibWindow::XlibWindow(this_01,this_00,width,height,visual);
  pWVar2[1]._vptr_Window = (_func_int **)this_01->m_window;
  pWVar2->_vptr_Window = (_func_int **)&PTR__VulkanWindowXlib_003e5d00;
  pWVar2[2]._vptr_Window = (_func_int **)this_01;
  return pWVar2;
}

Assistant:

VulkanWindowXlib (MovePtr<XlibWindow> window)
		: vk::wsi::XlibWindowInterface	(vk::pt::XlibWindow(window->getXID()))
		, m_window						(window)
	{
	}